

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O0

FILE * s3open(char *file_name,char *mode,uint32 *swap)

{
  int iVar1;
  long lVar2;
  FILE *local_30;
  FILE *fp;
  uint32 *swap_local;
  char *mode_local;
  char *file_name_local;
  
  local_30 = (FILE *)0x0;
  if ((*mode == 'r') && (mode[1] == 'b')) {
    local_30 = fopen(file_name,mode);
    if (local_30 == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                     ,0x104,"Unable to open %s for reading",file_name);
      return (FILE *)0x0;
    }
    iVar1 = rd_bin_hdr((FILE *)local_30,swap);
    if (iVar1 == 0) {
      return (FILE *)local_30;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
            ,0x109,"Error reading header for %s\n",file_name);
    goto LAB_00106b6c;
  }
  if ((*mode == 'w') && (mode[1] == 'b')) {
    local_30 = fopen(file_name,mode);
    if (local_30 == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                     ,0x115,"Unable to open %s for writing",file_name);
      goto LAB_00106b6c;
    }
    iVar1 = wr_bin_hdr((FILE *)local_30);
  }
  else {
    if ((*mode != 'a') || (mode[1] != 'b')) goto LAB_00106b6c;
    local_30 = fopen(file_name,mode);
    if (local_30 == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                     ,0x125,"Unable to open %s for appending",file_name);
      goto LAB_00106b6c;
    }
    lVar2 = ftell(local_30);
    if (lVar2 != 0) {
      return (FILE *)local_30;
    }
    iVar1 = wr_bin_hdr((FILE *)local_30);
  }
  if (iVar1 == 0) {
    return (FILE *)local_30;
  }
LAB_00106b6c:
  if (local_30 != (FILE *)0x0) {
    fclose(local_30);
  }
  return (FILE *)0x0;
}

Assistant:

FILE *
s3open(const char *file_name,
       const char *mode,
       uint32 *swap)
{
    FILE *fp = NULL;

    if (mode[0] == 'r' && mode[1] == 'b') {
	/* Read a binary file */

	fp = fopen(file_name, mode);
	if (fp == NULL) {
	    E_ERROR_SYSTEM("Unable to open %s for reading",
			  file_name);
	    return NULL;
	}

	if (rd_bin_hdr(fp, swap) != S3_SUCCESS) {
	    E_ERROR("Error reading header for %s\n", file_name);

	    goto error_loc;
	}

	return fp;
    }
    else if (mode[0] == 'w' && mode[1] == 'b') {
	/* Write a binary file */

	fp = fopen(file_name, mode);
	if (fp == NULL) {
	    E_ERROR_SYSTEM("Unable to open %s for writing", file_name);
	    
	    goto error_loc;
	}

	if (wr_bin_hdr(fp) != S3_SUCCESS) {
	    goto error_loc;
	}
	
	return fp;
    }
    else if (mode[0] == 'a' && mode[1] == 'b') {
	/* Append to a binary file. */

	fp = fopen(file_name, mode);
	if (fp == NULL) {
	    E_ERROR_SYSTEM("Unable to open %s for appending", file_name);
	    
	    goto error_loc;
	}

	if (ftell(fp) == 0) {
	    /* Write a header when no data */
	    if (wr_bin_hdr(fp) != S3_SUCCESS) {
		goto error_loc;
	    }
	}
	
	return fp;
    }
    
error_loc:
    if (fp)
	fclose(fp);

    return NULL;
}